

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcRootLogLikelihoodsPerCategory
          (BeagleCPUImpl<double,_1,_0> *this,int bufferIndex,int stateFrequenciesIndex,
          int scalingFactorsIndex,double *outLogLikelihoodPerCategory)

{
  undefined1 auVar1 [16];
  uint uVar2;
  double *pdVar3;
  double *pdVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  iVar11 = 0;
  lVar9 = 0;
  pdVar3 = this->gStateFrequencies[stateFrequenciesIndex];
  pdVar4 = this->gPartials[bufferIndex];
  for (iVar6 = 0; uVar5 = this->kCategoryCount, iVar6 < (int)uVar5; iVar6 = iVar6 + 1) {
    lVar9 = (long)(int)lVar9;
    for (iVar8 = 0; iVar8 < this->kPatternCount; iVar8 = iVar8 + 1) {
      auVar13 = ZEXT816(0) << 0x40;
      uVar5 = ~(this->kStateCount >> 0x1f) & this->kStateCount;
      for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
        auVar14._8_8_ = 0;
        auVar14._0_8_ = pdVar4[(long)iVar11 + uVar7];
        auVar1._8_8_ = 0;
        auVar1._0_8_ = pdVar3[uVar7];
        auVar13 = vfmadd231sd_fma(auVar13,auVar14,auVar1);
      }
      iVar11 = iVar11 + uVar5;
      dVar12 = log(auVar13._0_8_);
      outLogLikelihoodPerCategory[lVar9] = dVar12;
      lVar9 = lVar9 + 1;
    }
  }
  if (-1 < scalingFactorsIndex) {
    uVar2 = this->kPatternCount;
    pdVar3 = this->gScaleBuffers[(uint)scalingFactorsIndex];
    lVar9 = 0;
    for (uVar10 = 0; uVar10 != (~((int)uVar5 >> 0x1f) & uVar5); uVar10 = uVar10 + 1) {
      lVar9 = (long)(int)lVar9;
      for (uVar7 = 0; (~((int)uVar2 >> 0x1f) & uVar2) != uVar7; uVar7 = uVar7 + 1) {
        outLogLikelihoodPerCategory[lVar9 + uVar7] =
             pdVar3[uVar7] + outLogLikelihoodPerCategory[lVar9 + uVar7];
      }
      lVar9 = lVar9 + uVar7;
    }
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsPerCategory(
        const int bufferIndex,
        const int stateFrequenciesIndex,
        const int scalingFactorsIndex,
        double* outLogLikelihoodPerCategory) {

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* rootPartials = gPartials[bufferIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];

    int u = 0;
    int v = 0;
    for (int l = 0; l < kCategoryCount; l++) {
        for (int k = 0; k < kPatternCount; k++) {
            REALTYPE sum = 0.0;
            for (int i = 0; i < kStateCount; i++) {
                sum += rootPartials[v] * freqs[i];
                v++;
            }
            outLogLikelihoodPerCategory[u] = log(sum);
            u++;
            v += P_PAD;
        }
    }

    if (scalingFactorsIndex >= 0) {
        const REALTYPE* cumulativeScaleFactors = gScaleBuffers[scalingFactorsIndex];
        int u = 0;
        for (int l = 0; l < kCategoryCount; l++) {
            for (int i = 0; i < kPatternCount; i++) {
                outLogLikelihoodPerCategory[u] += cumulativeScaleFactors[i];
                u++;
            }
        }
    }

    return returnCode;
}